

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_helper.c
# Opt level: O2

int nghttp2_check_header_name(uint8_t *name,size_t len)

{
  byte *pbVar1;
  size_t sVar2;
  
  if (len != 0) {
    if (*name == ':') {
      if (len == 1) {
        return 0;
      }
      name = name + 1;
      len = len - 1;
    }
    sVar2 = 0;
    do {
      if (len == sVar2) {
        return 1;
      }
      pbVar1 = name + sVar2;
      sVar2 = sVar2 + 1;
    } while (VALID_HD_NAME_CHARS[*pbVar1] != 0);
  }
  return 0;
}

Assistant:

int nghttp2_check_header_name(const uint8_t *name, size_t len) {
  const uint8_t *last;
  if (len == 0) {
    return 0;
  }
  if (*name == ':') {
    if (len == 1) {
      return 0;
    }
    ++name;
    --len;
  }
  for (last = name + len; name != last; ++name) {
    if (!VALID_HD_NAME_CHARS[*name]) {
      return 0;
    }
  }
  return 1;
}